

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  GetterXsYs<short> *pGVar6;
  TransformerLinLog *pTVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<short> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  double dVar12;
  undefined1 auVar13 [12];
  ImPlotContext *pIVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  ushort uVar18;
  ImDrawIdx IVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar41 [16];
  
  pIVar14 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar16 = pGVar6->Count;
  lVar17 = (long)(((pGVar6->Offset + prim + 1) % iVar16 + iVar16) % iVar16) * (long)pGVar6->Stride;
  sVar3 = *(short *)((long)pGVar6->Xs + lVar17);
  dVar12 = log10((double)(int)*(short *)((long)pGVar6->Ys + lVar17) /
                 GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  pIVar15 = GImPlot;
  iVar16 = pTVar7->YAxis;
  pIVar8 = pIVar14->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar16].Range.Min;
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar5 = pGVar9->Count;
  sVar4 = *(short *)((long)pGVar9->Xs +
                    (long)(((prim + 1 + pGVar9->Offset) % iVar5 + iVar5) % iVar5) *
                    (long)pGVar9->Stride);
  IVar2 = pIVar14->PixelRange[iVar16].Min;
  fVar27 = (float)(pIVar14->Mx * ((double)(int)sVar3 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x)
  ;
  fVar29 = (float)(pIVar14->My[iVar16] *
                   (((double)(float)(dVar12 / pIVar14->LogDenY[iVar16]) *
                     (pIVar8->YAxis[iVar16].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  dVar12 = log10(pGVar9->YRef / GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar16 = pTVar7->YAxis;
  pIVar8 = pIVar15->CurrentPlot;
  dVar1 = pIVar8->YAxis[iVar16].Range.Min;
  IVar2 = pIVar15->PixelRange[iVar16].Min;
  fVar25 = (float)(pIVar15->Mx * ((double)(int)sVar4 - (pIVar8->XAxis).Range.Min) + (double)IVar2.x)
  ;
  fVar26 = (float)(pIVar15->My[iVar16] *
                   (((double)(float)(dVar12 / pIVar15->LogDenY[iVar16]) *
                     (pIVar8->YAxis[iVar16].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar28 = (this->P12).x;
  fVar30 = (this->P12).y;
  fVar32 = (this->P11).y;
  fVar37 = (this->P11).x;
  uVar23 = -(uint)(fVar32 < fVar30);
  fVar31 = (float)(~-(uint)(fVar28 <= fVar37) & (uint)fVar28 |
                  (uint)fVar37 & -(uint)(fVar28 <= fVar37));
  fVar33 = (float)(~-(uint)(fVar30 <= fVar32) & (uint)fVar30 |
                  (uint)fVar32 & -(uint)(fVar30 <= fVar32));
  fVar36 = (float)(~-(uint)(fVar37 < fVar28) & (uint)fVar28 |
                  (uint)fVar37 & -(uint)(fVar37 < fVar28));
  fVar45 = (float)(~uVar23 & (uint)fVar30 | (uint)fVar32 & uVar23);
  uVar20 = -(uint)(fVar27 <= fVar31);
  uVar21 = -(uint)(fVar29 <= fVar33);
  uVar22 = -(uint)(fVar36 < fVar27);
  uVar24 = -(uint)(fVar45 < fVar29);
  fVar31 = (float)(~uVar20 & (uint)fVar27 | (uint)fVar31 & uVar20);
  fVar33 = (float)(~uVar21 & (uint)fVar29 | (uint)fVar33 & uVar21);
  fVar36 = (float)(~uVar22 & (uint)fVar27 | (uint)fVar36 & uVar22);
  fVar45 = (float)(~uVar24 & (uint)fVar29 | (uint)fVar45 & uVar24);
  uVar20 = -(uint)(fVar25 <= fVar31);
  uVar21 = -(uint)(fVar26 <= fVar33);
  uVar22 = -(uint)(fVar36 < fVar25);
  uVar24 = -(uint)(fVar45 < fVar26);
  auVar35._0_4_ = (uint)fVar31 & uVar20;
  auVar35._4_4_ = (uint)fVar33 & uVar21;
  auVar35._8_4_ = (uint)fVar36 & uVar22;
  auVar35._12_4_ = (uint)fVar45 & uVar24;
  auVar42._0_4_ = ~uVar20 & (uint)fVar25;
  auVar42._4_4_ = ~uVar21 & (uint)fVar26;
  auVar42._8_4_ = ~uVar22 & (uint)fVar25;
  auVar42._12_4_ = ~uVar24 & (uint)fVar26;
  auVar42 = auVar42 | auVar35;
  fVar31 = (cull_rect->Min).y;
  auVar44._4_4_ = -(uint)(fVar31 < auVar42._4_4_);
  auVar44._0_4_ = -(uint)((cull_rect->Min).x < auVar42._0_4_);
  auVar13._4_8_ = auVar42._8_8_;
  auVar13._0_4_ = -(uint)(auVar42._4_4_ < fVar31);
  auVar43._0_8_ = auVar13._0_8_ << 0x20;
  auVar43._8_4_ = -(uint)(auVar42._8_4_ < (cull_rect->Max).x);
  auVar43._12_4_ = -(uint)(auVar42._12_4_ < (cull_rect->Max).y);
  auVar44._8_8_ = auVar43._8_8_;
  iVar16 = movmskps((int)cull_rect,auVar44);
  if (iVar16 == 0xf) {
    fVar33 = fVar29 * fVar37 - fVar32 * fVar27;
    fVar36 = fVar26 * fVar28 - fVar30 * fVar25;
    fVar31 = fVar30 - fVar26;
    auVar38._4_4_ = fVar31;
    auVar38._0_4_ = fVar31;
    auVar38._8_4_ = fVar31;
    auVar38._12_4_ = fVar31;
    auVar39._4_12_ = auVar38._4_12_;
    auVar39._0_4_ = fVar31 * (fVar37 - fVar27) - (fVar32 - fVar29) * (fVar28 - fVar25);
    auVar34._0_4_ = fVar33 * (fVar28 - fVar25) - fVar36 * (fVar37 - fVar27);
    auVar34._4_4_ = fVar33 * fVar31 - fVar36 * (fVar32 - fVar29);
    auVar34._8_4_ = fVar29 * 0.0 - fVar26 * 0.0;
    auVar34._12_4_ = fVar29 * 0.0 - fVar26 * 0.0;
    auVar41._0_8_ = auVar39._0_8_;
    auVar41._8_4_ = fVar31;
    auVar41._12_4_ = fVar31;
    auVar40._8_8_ = auVar41._8_8_;
    auVar40._4_4_ = auVar39._0_4_;
    auVar40._0_4_ = auVar39._0_4_;
    auVar35 = divps(auVar34,auVar40);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = this->Col;
    pIVar10[1].pos.x = fVar27;
    pIVar10[1].pos.y = fVar29;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = this->Col;
    pIVar10[2].pos = auVar35._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = this->Col;
    pIVar10[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = this->Col;
    IVar2.y = fVar26;
    IVar2.x = fVar25;
    pIVar10[4].pos = IVar2;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar10 + 5;
    uVar20 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar20;
    *pIVar11 = IVar19;
    uVar18 = (byte)((byte)uVar23 & fVar26 < fVar29 | -(fVar30 < fVar32) & -(fVar29 < fVar26)) & 1;
    pIVar11[1] = IVar19 + uVar18 + 1;
    pIVar11[2] = IVar19 + 3;
    pIVar11[3] = IVar19 + 1;
    pIVar11[4] = (uVar18 ^ 3) + IVar19;
    pIVar11[5] = IVar19 + 4;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar20 + 5;
  }
  (this->P11).x = fVar27;
  (this->P11).y = fVar29;
  (this->P12).x = fVar25;
  (this->P12).y = fVar26;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }